

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O3

char * __thiscall fmt::v6::format_int::format_decimal(format_int *this,unsigned_long_long value)

{
  bool bVar1;
  long lVar2;
  byte bVar3;
  ulong uVar4;
  char *pcVar5;
  
  pcVar5 = this->buffer_ + 0x15;
  uVar4 = value;
  if (99 < value) {
    do {
      value = uVar4 / 100;
      *(undefined2 *)(pcVar5 + -2) =
           *(undefined2 *)
            (internal::basic_data<void>::digits + (ulong)(uint)((int)uVar4 + (int)value * -100) * 2)
      ;
      pcVar5 = pcVar5 + -2;
      bVar1 = 9999 < uVar4;
      uVar4 = value;
    } while (bVar1);
  }
  if (value < 10) {
    bVar3 = (byte)value | 0x30;
    lVar2 = -1;
  }
  else {
    pcVar5[-1] = internal::basic_data<void>::digits[(value * 2 & 0xffffffff) + 1];
    bVar3 = internal::basic_data<void>::digits[value * 2 & 0x1fffffffe];
    lVar2 = -2;
  }
  pcVar5[lVar2] = bVar3;
  return pcVar5 + lVar2;
}

Assistant:

char* format_decimal(unsigned long long value) {
    char* ptr = buffer_ + (buffer_size - 1);  // Parens to workaround MSVC bug.
    while (value >= 100) {
      // Integer division is slow so do it for a group of two digits instead
      // of for every digit. The idea comes from the talk by Alexandrescu
      // "Three Optimization Tips for C++". See speed-test for a comparison.
      auto index = static_cast<unsigned>((value % 100) * 2);
      value /= 100;
      *--ptr = internal::data::digits[index + 1];
      *--ptr = internal::data::digits[index];
    }
    if (value < 10) {
      *--ptr = static_cast<char>('0' + value);
      return ptr;
    }
    auto index = static_cast<unsigned>(value * 2);
    *--ptr = internal::data::digits[index + 1];
    *--ptr = internal::data::digits[index];
    return ptr;
  }